

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void __thiscall
loader::Logger::Logger
          (Logger *this,string *logger_name,Console out,string *log_level,bool logging_enabled_env,
          string *format)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  logger *plVar1;
  pointer pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined7 in_register_00000081;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> sink;
  undefined1 local_89;
  logger *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_> local_78;
  string local_68;
  string local_48;
  
  this->log_to_console = true;
  this->logging_enabled = false;
  (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((int)CONCAT71(in_register_00000081,logging_enabled_env) != 0) {
    this->logging_enabled = true;
    if (out == out_stderr) {
      local_78.
      super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,std::allocator<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>>>
                (&local_78.
                  super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(ansicolor_stderr_sink<spdlog::details::console_mutex> **)&local_78,
                 (allocator<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_> *
                 )&local_88);
      local_88 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<spdlog::logger,std::allocator<spdlog::logger>,std::__cxx11::string&,std::shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>>>
                (&_Stack_80,&local_88,(allocator<spdlog::logger> *)&local_89,logger_name,&local_78);
    }
    else {
      if (out != out_stdout) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Invalid console output specified\n",0x21);
        this->logging_enabled = false;
        return;
      }
      local_78.
      super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,std::allocator<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>>
                (&local_78.
                  super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(ansicolor_stdout_sink<spdlog::details::console_mutex> **)&local_78,
                 (allocator<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> *
                 )&local_88);
      local_88 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<spdlog::logger,std::allocator<spdlog::logger>,std::__cxx11::string&,std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>>
                (&_Stack_80,&local_88,(allocator<spdlog::logger> *)&local_89,logger_name,
                 (shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_>
                  *)&local_78);
    }
    _Var3._M_pi = _Stack_80._M_pi;
    plVar1 = local_88;
    local_88 = (logger *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = plVar1;
    (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var3._M_pi;
    if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
       _Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
    }
    if (local_78.
        super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.
                 super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (format->_M_string_length != 0) {
      plVar1 = (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pcVar2 = (format->_M_dataplus)._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + format->_M_string_length);
      spdlog::logger::set_pattern(plVar1,&local_48,local);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar2 = (log_level->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + log_level->_M_string_length);
    setLogLevel(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

Logger(std::string logger_name, Console out, std::string log_level, bool logging_enabled_env, std::string format = "") {
    if (logging_enabled_env) {
      logging_enabled = logging_enabled_env;
      try {
        if (out == Console::out_stdout) {
          auto sink = std::make_shared<spdlog::sinks::ansicolor_stdout_sink_mt>();
          _logger = std::make_shared<spdlog::logger>(logger_name, std::move(sink));
        } else if (out == Console::out_stderr) {
          auto sink = std::make_shared<spdlog::sinks::ansicolor_stderr_sink_mt>();
          _logger = std::make_shared<spdlog::logger>(logger_name, std::move(sink));
        } else {
          std::cerr << "Invalid console output specified\n";
          logging_enabled = false;
          return;
        }
      } catch (spdlog::spdlog_ex &exception) {
        std::cerr << "Unable to create log stdout logger " << exception.what() << "\n";
        logging_enabled = false;
        return;
      }

      if (!format.empty()) {
        _logger->set_pattern(format);
      }

      setLogLevel(log_level);
    }
  }